

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O0

void replay_getlin(char *query,char *buf)

{
  int iVar1;
  char *__s;
  char *in;
  char *token;
  char *encdata;
  char *buf_local;
  char *query_local;
  
  __s = next_log_token();
  in = strchr(__s,0x3a);
  if ((*__s == 'l') && (in != (char *)0x0)) {
    iVar1 = base64_strlen(in);
    if (0x100 < iVar1) {
      parse_error("Encoded getlin string is too long to decode into the target buffer.");
    }
    base64_decode(in + 1,buf);
    return;
  }
  parse_error("Bad getlin data");
}

Assistant:

static void replay_getlin(const char *query, char *buf)
{
    char *encdata, *token = next_log_token();
    
    encdata = strchr(token, ':');
    if (token[0] != 'l' || !encdata)
	parse_error("Bad getlin data");
    
    if (base64_strlen(encdata) > EQBUFSZ)
	parse_error("Encoded getlin string is too long to decode into the target buffer.");
    
    base64_decode(encdata+1, buf);
}